

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool __thiscall Chainstate::NeedsRedownload(Chainstate *this)

{
  long lVar1;
  pointer ppCVar2;
  bool bVar3;
  CBlockIndex *index;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ppCVar2 = (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar2 ==
      (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    index = (CBlockIndex *)0x0;
  }
  else {
    index = ppCVar2[-1];
  }
  for (; index != (CBlockIndex *)0x0; index = index->pprev) {
    bVar3 = DeploymentActiveAt<Consensus::BuriedDeployment>
                      (index,this->m_chainman,DEPLOYMENT_SEGWIT);
    if (!bVar3) break;
    if ((index->nStatus & 0x80) == 0) {
      bVar3 = true;
      goto LAB_00368da2;
    }
  }
  bVar3 = false;
LAB_00368da2:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool Chainstate::NeedsRedownload() const
{
    AssertLockHeld(cs_main);

    // At and above m_params.SegwitHeight, segwit consensus rules must be validated
    CBlockIndex* block{m_chain.Tip()};

    while (block != nullptr && DeploymentActiveAt(*block, m_chainman, Consensus::DEPLOYMENT_SEGWIT)) {
        if (!(block->nStatus & BLOCK_OPT_WITNESS)) {
            // block is insufficiently validated for a segwit client
            return true;
        }
        block = block->pprev;
    }

    return false;
}